

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  ulong uVar1;
  bool bVar2;
  reference ppTVar3;
  char *pcVar4;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar5;
  size_type sVar6;
  reference ppTVar7;
  int in_ESI;
  long in_RDI;
  string *in_stack_00000038;
  string *in_stack_00000040;
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int num_selected_tests;
  int num_runnable_tests;
  int32_t shard_index;
  int32_t total_shards;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  TestSuite *in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffef9;
  byte in_stack_fffffffffffffefa;
  undefined1 in_stack_fffffffffffffefb;
  bool bVar8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  undefined8 in_stack_ffffffffffffff30;
  int32_t default_val;
  allocator *paVar9;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  allocator local_b1;
  string local_b0 [32];
  value_type local_90;
  ulong local_88;
  allocator local_69;
  string local_68 [32];
  string *local_48;
  TestSuite *local_40;
  TestSuite **local_38;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_30;
  long local_28;
  int local_1c;
  int local_18;
  int32_t local_14;
  int32_t local_10;
  int local_c;
  
  default_val = (int32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_c = in_ESI;
  if (in_ESI == 0) {
    local_10 = Int32FromEnvOrDie((char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),default_val);
  }
  else {
    local_10 = -1;
  }
  if (local_c == 0) {
    local_14 = Int32FromEnvOrDie((char *)CONCAT44(local_10,in_stack_ffffffffffffff38),default_val);
  }
  else {
    local_14 = -1;
  }
  local_18 = 0;
  local_1c = 0;
  local_28 = in_RDI + 0xb8;
  local_30._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                  CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  local_38 = (TestSuite **)
             std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                       ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                        CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    if (!bVar2) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppTVar3;
    pcVar4 = TestSuite::name((TestSuite *)0x155c77);
    paVar9 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar4,paVar9);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = local_68;
    TestSuite::set_should_run(local_40,false);
    local_88 = 0;
    while( true ) {
      uVar1 = local_88;
      pvVar5 = TestSuite::test_info_list(local_40);
      sVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar5);
      if (sVar6 <= uVar1) break;
      pvVar5 = TestSuite::test_info_list(local_40);
      ppTVar7 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar5,local_88);
      local_90 = *ppTVar7;
      pcVar4 = TestInfo::name((TestInfo *)0x155d5b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,pcVar4,&local_b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      in_stack_fffffffffffffeff =
           UnitTestOptions::MatchesFilter
                     ((string *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,
                                        CONCAT15(in_stack_fffffffffffffefd,
                                                 CONCAT14(in_stack_fffffffffffffefc,
                                                          CONCAT13(in_stack_fffffffffffffefb,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffefa,
                                                  CONCAT11(in_stack_fffffffffffffef9,
                                                           in_stack_fffffffffffffef8))))))),
                      (char *)in_stack_fffffffffffffef0);
      bVar2 = true;
      if (!(bool)in_stack_fffffffffffffeff) {
        in_stack_fffffffffffffefd =
             UnitTestOptions::MatchesFilter
                       ((string *)
                        CONCAT17(in_stack_fffffffffffffeff,
                                 CONCAT16(1,CONCAT15(in_stack_fffffffffffffefd,
                                                     CONCAT14(in_stack_fffffffffffffefc,
                                                              CONCAT13(in_stack_fffffffffffffefb,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffefa,
                                                  CONCAT11(in_stack_fffffffffffffef9,
                                                           in_stack_fffffffffffffef8))))))),
                        (char *)in_stack_fffffffffffffef0);
        bVar2 = (bool)in_stack_fffffffffffffefd;
      }
      local_90->is_disabled_ = bVar2;
      in_stack_fffffffffffffefe = bVar2;
      in_stack_fffffffffffffefc =
           UnitTestOptions::FilterMatchesTest(in_stack_00000040,in_stack_00000038);
      local_90->matches_filter_ = (bool)in_stack_fffffffffffffefc;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) || (bVar8 = false, bVar2 == false)) {
        bVar8 = (bool)in_stack_fffffffffffffefc;
      }
      in_stack_fffffffffffffefa = 0;
      in_stack_fffffffffffffefb = bVar8;
      if (local_c != 1) {
        bVar2 = ShouldRunTestOnShard(local_10,local_14,local_18);
        in_stack_fffffffffffffefa = bVar2 ^ 0xff;
      }
      local_90->is_in_another_shard_ = (bool)(in_stack_fffffffffffffefa & 1);
      in_stack_fffffffffffffef9 = 0;
      if (bVar8 != false) {
        in_stack_fffffffffffffef9 = in_stack_fffffffffffffefa & 1 ^ 0xff;
      }
      bVar2 = (bool)(in_stack_fffffffffffffef9 & 1);
      local_18 = local_18 + (uint)bVar8;
      local_1c = local_1c + (uint)bVar2;
      local_90->should_run_ = bVar2;
      in_stack_fffffffffffffef0 = local_40;
      in_stack_fffffffffffffef8 = TestSuite::should_run(local_40);
      in_stack_fffffffffffffeef = true;
      if (!(bool)in_stack_fffffffffffffef8) {
        in_stack_fffffffffffffeef = bVar2;
      }
      TestSuite::set_should_run(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
      std::__cxx11::string::~string(local_b0);
      local_88 = local_88 + 1;
    }
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_30);
  }
  return local_1c;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}